

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packets.c
# Opt level: O2

int rtr_receive_pdu(rtr_socket *rtr_socket,void *pdu,size_t pdu_len,time_t timeout)

{
  long lVar1;
  spki_table *psVar2;
  pfx_table *ppVar3;
  aspa_table *dst;
  aspa_update_fp p_Var4;
  byte bVar5;
  undefined8 uVar6;
  unkbyte10 Var7;
  uint8_t uVar8;
  char *pcVar9;
  char cVar10;
  uint16_t uVar11;
  int iVar12;
  int extraout_EAX;
  int extraout_EAX_00;
  uint uVar13;
  int iVar14;
  uint32_t uVar15;
  rtr_socket *__dest;
  pdu_header pfx_table;
  spki_table *extraout_RAX;
  size_t sVar16;
  spki_table *extraout_RAX_00;
  spki_table *spki_table;
  char cVar17;
  pdu_error_type error;
  ulong uVar18;
  void **ary;
  code *UNRECOVERED_JUMPTABLE;
  uint *pdu_len_00;
  undefined4 uVar19;
  undefined6 uVar20;
  undefined8 *puVar21;
  undefined8 *puVar22;
  undefined8 *puVar23;
  uint uVar24;
  target_byte_order tbo;
  rtr_socket *unaff_RBP;
  rtr_socket *prVar25;
  rtr_socket_state rVar26;
  undefined1 *pdu_00;
  rtr_socket *rtr_socket_00;
  uint *in_R8;
  char *pcVar27;
  int iVar28;
  __pthread_unwind_buf_t *__buf;
  size_t unaff_R15;
  pdu_header pVar29;
  ulong uVar30;
  long in_FS_OFFSET;
  bool bVar31;
  undefined1 auVar32 [16];
  pdu_router_key *unaff_retaddr;
  uint in_stack_00000008;
  pdu_ipv4 *in_stack_00000010;
  uint in_stack_0000001c;
  pdu_ipv6 *in_stack_00000020;
  uint8_t in_stack_00000028;
  byte in_stack_00000029;
  ushort in_stack_0000002a;
  uint32_t in_stack_00000034;
  uint32_t in_stack_00000038;
  uint32_t in_stack_0000003c;
  undefined8 local_78;
  pdu_header header;
  char txt [43];
  
  puVar21 = &local_78;
  puVar23 = &local_78;
  puVar22 = &local_78;
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pfx_table.ver = 0xff;
  pfx_table.type = 0xff;
  pfx_table.reserved = 0xffff;
  pfx_table.len = 0xffffffff;
  iVar28 = -1;
  iVar14 = iVar28;
  if (rtr_socket->state == RTR_SHUTDOWN) goto LAB_00109932;
  iVar12 = tr_recv_all(rtr_socket->tr_socket,pdu,8,pdu_len);
  if (iVar12 < 0) {
LAB_00109a45:
    if (iVar12 == -3) {
      lrtr_dbg("RTR Socket: receive call interrupted");
      iVar14 = -3;
      goto LAB_00109932;
    }
    if (iVar12 == -2) {
      lrtr_dbg("RTR Socket: receive timeout expired");
      iVar14 = -2;
      goto LAB_00109932;
    }
    if (iVar12 != -1) goto LAB_00109924;
    rVar26 = RTR_ERROR_TRANSPORT;
    goto LAB_00109926;
  }
  header = *pdu;
  rtr_pdu_convert_header_byte_order(&header,TO_HOST_HOST_BYTE_ORDER);
  uVar15 = header.len;
  if (header.len < 8) goto LAB_0010989d;
  if (0xffff < header.len) {
    lrtr_dbg("RTR Socket: PDU too big");
    pcVar27 = txt;
    snprintf(pcVar27,0x2b,"PDU too big, max. PDU size is: %lu bytes");
    lrtr_dbg("RTR Socket: %s",pcVar27);
    uVar15 = 0x2b;
    goto LAB_0010991f;
  }
  uVar8 = header.type;
  __buf = (__pthread_unwind_buf_t *)(ulong)header.type;
  prVar25 = unaff_RBP;
  if (rtr_socket->has_received_pdus == false) {
    if (header.type != '\n') {
      uVar13 = rtr_socket->version;
      prVar25 = (rtr_socket *)((ulong)header & 0xff);
      uVar24 = (uint)header.ver;
      if ((header.ver <= uVar13 && uVar13 != uVar24) && header.ver < 3) {
        lrtr_dbg("RTR Socket: First received PDU is a version %u PDU, downgrading from version %u to %u"
                 ,(ulong)uVar24,(ulong)uVar13,(ulong)uVar24);
        rtr_socket->version = uVar24;
      }
    }
    rtr_socket->has_received_pdus = true;
  }
  pdu_00 = (undefined1 *)((ulong)header & 0xff);
  if (rtr_socket->version != (uint)header.ver && uVar8 != '\n') {
    lrtr_dbg("RTR Socket: PDU with unexpected Protocol version (%u) received");
    error = UNEXPECTED_PROTOCOL_VERSION;
LAB_001099c8:
    rtr_send_error_pdu(rtr_socket,pdu,8,error,(char *)0x0,0);
    iVar14 = iVar28;
    goto LAB_00109932;
  }
  if (uVar15 - 8 != 0) {
    if (rtr_socket->state == RTR_SHUTDOWN) goto LAB_00109932;
    pdu_00 = (undefined1 *)((long)pdu + 8);
    iVar12 = tr_recv_all(rtr_socket->tr_socket,pdu_00,(ulong)(uVar15 - 8),0x3c);
    if (iVar12 < 0) goto LAB_00109a45;
  }
  pVar29 = header;
  *(pdu_header *)pdu = header;
  pcVar27 = "RTR Socket: PDU type is unknown or reserved!";
  if (0xb < header.type) goto switchD_00109a35_caseD_5;
  __dest = (rtr_socket *)((ulong)header >> 0x20);
  uVar30 = (ulong)header >> 8 & 0xff;
  pdu_len_00 = &switchD_00109a35::switchdataD_00114f64;
  auVar32._8_8_ = &switchD_00109a35::switchdataD_00114f64;
  auVar32._0_8_ = __dest;
  Var7 = auVar32._0_10_;
  uVar18 = (ulong)(int)(&switchD_00109a35::switchdataD_00114f64)[uVar30];
  bVar31 = 0xffffffffffeeb09b < uVar18;
  ary = (void **)((long)&switchD_00109a35::switchdataD_00114f64 + uVar18);
  bVar5 = POPCOUNT((ulong)ary & 0xff);
  cVar10 = (char)header.len;
  cVar17 = (char)ary;
  uVar20 = (undefined6)((ulong)rtr_socket >> 0x10);
  tbo = (target_byte_order)prVar25;
  pcVar9 = (char *)&local_78;
  rtr_socket_00 = (rtr_socket *)pcVar27;
  switch(uVar30) {
  case 0:
  case 1:
switchD_00109a35_caseD_0:
    if (header.len == 0xc) {
LAB_00109b89:
      rtr_pdu_convert_footer_byte_order(pdu,TO_HOST_HOST_BYTE_ORDER);
      if ((uVar8 & 0xfd) == 4) {
        if (*(char *)((long)pdu + 0xb) == '\0') {
          iVar14 = 0;
          goto LAB_00109932;
        }
        pcVar27 = "RTR Socket: Warning: Zero field of received Prefix PDU doesn\'t contain 0";
      }
      else {
        iVar14 = 0;
        if (uVar8 == '\t') {
          if (*(char *)((long)pdu + 3) == '\0') goto LAB_00109932;
          pcVar27 = "RTR Socket: Warning: ROUTER_KEY_PDU zero field is != 0";
        }
        else {
          if (uVar8 != '\v') goto LAB_00109932;
          if (*pdu != '\x02') {
            lrtr_dbg("RTR Socket: PDU with unsupported Protocol version (%u) received",
                     (ulong)pVar29 & 0xff);
            error = UNSUPPORTED_PROTOCOL_VER;
            goto LAB_001099c8;
          }
          if (*(short *)((long)pdu + 2) != 0) {
            lrtr_dbg("RTR Socket: Warning: Zero field of received ASPA PDU doesn\'t contain 0");
          }
          if (*(char *)((long)pdu + 9) == '\x03') goto LAB_00109932;
          pcVar27 = "RTR Socket: Warning: AFI flags of received ASPA PDU not set to 0x03";
        }
      }
      lrtr_dbg(pcVar27);
      iVar14 = 0;
      goto LAB_00109932;
    }
    break;
  case 2:
  case 3:
  case 8:
    if (header.len == 8) goto LAB_00109b89;
    break;
  case 4:
    if (header.len == 0x14) goto LAB_00109b89;
    break;
  case 5:
    goto switchD_00109a35_caseD_5;
  case 6:
    if (header.len == 0x20) goto LAB_00109b89;
    break;
  case 7:
    if (header.ver == 0) goto switchD_00109a35_caseD_0;
    if (header.ver < 3 && header.len == 0x18) goto LAB_00109b89;
    break;
  case 9:
    if (header.len == 0x7b) goto LAB_00109b89;
    break;
  case 10:
    if ((ulong)header >> 0x24 == 0) {
      pcVar27 = "RTR Socket: PDU is too small to contain \"Length of Error Text\" field!";
    }
    else {
      uVar13 = *(uint *)((long)pdu + 8);
      uVar13 = uVar13 >> 0x18 | (uVar13 & 0xff0000) >> 8 | (uVar13 & 0xff00) << 8 | uVar13 << 0x18;
      lrtr_dbg("RTR Socket: enc_pdu_len: %u",(ulong)uVar13);
      prVar25 = (rtr_socket *)((ulong)uVar13 + 0x10);
      if ((rtr_socket *)(ulong)*(uint *)((long)pdu + 4) < prVar25) {
        pcVar27 = "RTR Socket: PDU is too small to contain erroneous PDU!";
      }
      else {
        uVar13 = *(uint *)((long)pdu + (ulong)uVar13 + 0xc);
        uVar13 = uVar13 >> 0x18 | (uVar13 & 0xff0000) >> 8 | (uVar13 & 0xff00) << 8 | uVar13 << 0x18
        ;
        local_78 = prVar25;
        lrtr_dbg("RTR Socket: err_msg_len: %u",(ulong)uVar13);
        if ((long)&local_78->tr_socket + (ulong)uVar13 == (ulong)*(uint *)((long)pdu + 4))
        goto LAB_00109b89;
        pcVar27 = "RTR Socket: PDU is too small to contain error_msg!";
      }
    }
    goto switchD_00109a35_caseD_5;
  case 0xb:
    if ((ulong)header >> 0x24 == 0) {
      pcVar27 = "RTR Socket: PDU is too small to contain ASPA PDU!";
    }
    else {
      if ((uint)(ushort)(*(ushort *)((long)pdu + 10) << 8 | *(ushort *)((long)pdu + 10) >> 8) * 4 +
          0x10 == header.len) goto LAB_00109b89;
      pcVar27 = 
      "RTR Socket: The PDU is malformed, because the specified size doesn\'t match the real PDU size."
      ;
    }
switchD_00109a35_caseD_5:
    lrtr_dbg(pcVar27);
    break;
  case 0xc:
    pcVar27 = "RTR Socket: Error PDU received";
    local_78 = __dest;
    goto code_r0x00109c7d;
  case 0xd:
    rtr_socket = (rtr_socket *)((ulong)rtr_socket & 0xffffffffffffff00);
    *(char *)ary = *(char *)ary + 'O';
    __dest = (rtr_socket *)(((ulong)header >> 0x28) << 8);
    pcVar27 = (char *)0x8ab4d;
  case 0x11:
    uVar13 = (uint)__dest;
    *(int *)pcVar27 = *(int *)pcVar27 + -1;
    goto code_r0x00109ce9;
  case 0xe:
    goto switchD_00109a35_caseD_e;
  case 0xf:
    *(char *)&__dest->tr_socket = *(char *)&__dest->tr_socket + cVar10;
    __dest[-1].field_0xd = __dest[-1].field_0xd + cVar17;
    goto code_r0x00109cdf;
  case 0x10:
    *(char *)&__dest->tr_socket = *(char *)&__dest->tr_socket + cVar10;
code_r0x00109c7d:
    lrtr_dbg(pcVar27);
    switch(*(undefined2 *)((long)&rtr_socket->tr_socket + 2)) {
    case 0:
      pcVar27 = "RTR Socket: Corrupt data received";
      break;
    case 1:
      pcVar27 = "RTR Socket: Internal error on server-side";
      break;
    case 2:
      lrtr_dbg("RTR Socket: No data available");
      rVar26 = RTR_ERROR_NO_DATA_AVAIL;
      goto LAB_00109d25;
    case 3:
      pcVar27 = "RTR Socket: Invalid request from client";
      break;
    case 4:
      lrtr_dbg("RTR Socket: Client uses unsupported protocol version");
      pdu_len_00 = (uint *)(ulong)*(byte *)&rtr_socket->tr_socket;
      bVar31 = *(byte *)&rtr_socket->tr_socket < 3;
switchD_00109a35_caseD_e:
      if ((bool)((uint)pdu_len_00 < *(uint *)((long)pdu + 0x60) & bVar31)) {
        pcVar27 = "RTR Socket: Downgrading from %i to version %i";
code_r0x00109cdf:
        lrtr_dbg(pcVar27);
        uVar13 = (uint)*(byte *)&rtr_socket->tr_socket;
code_r0x00109ce9:
        *(uint *)((long)pdu + 0x60) = uVar13;
        rVar26 = RTR_FAST_RECONNECT;
        goto LAB_00109d25;
      }
      lrtr_dbg(
              "RTR Socket: Got UNSUPPORTED_PROTOCOL_VER error PDU with invalid values, current version:%i, PDU version:%i"
              );
      goto LAB_00109d23;
    case 5:
      pcVar27 = "RTR Socket: Client set unsupported PDU type";
      break;
    default:
      lrtr_dbg("RTR Socket: error unknown, server sent unsupported error code %u");
      goto LAB_00109d23;
    }
    lrtr_dbg(pcVar27);
LAB_00109d23:
    rVar26 = RTR_ERROR_FATAL;
LAB_00109d25:
    rtr_change_socket_state((rtr_socket *)pdu,rVar26);
    uVar30 = (ulong)rtr_socket->refresh_interval;
    uVar18 = (ulong)*(uint *)(&rtr_socket->field_0xc + uVar30);
    if (uVar18 == 0) {
      if (*(rtr_socket **)(in_FS_OFFSET + 0x28) == local_78) {
        return (int)*(rtr_socket **)(in_FS_OFFSET + 0x28);
      }
    }
    else if (uVar30 + uVar18 + 0x10 == (ulong)*(uint *)((long)&rtr_socket->tr_socket + 4)) {
      if (*(rtr_socket **)(in_FS_OFFSET + 0x28) == local_78) {
        lrtr_dbg("RTR Socket: Error PDU included the following error msg: \'%.*s\'",uVar18,
                 (long)&rtr_socket->last_update + uVar30);
        return extraout_EAX;
      }
    }
    else if (*(rtr_socket **)(in_FS_OFFSET + 0x28) == local_78) {
      lrtr_dbg("RTR Socket: error: Length of error text contains an incorrect value");
      return extraout_EAX_00;
    }
    __stack_chk_fail();
  case 0x12:
code_r0x00109f83:
    uVar13 = rtr_receive_pdu((rtr_socket *)pcVar27,pdu_00,(size_t)pdu_len_00,(time_t)ary);
    rtr_socket = (rtr_socket *)(ulong)uVar13;
    pthread_setcancelstate(1,(int *)pVar29);
    pcVar27 = (char *)__buf;
  case 0x16:
    __pthread_unregister_cancel((__pthread_unwind_buf_t *)pcVar27);
    if ((int)rtr_socket == -2) {
      rVar26 = RTR_ERROR_TRANSPORT;
LAB_0010a52a:
      rtr_change_socket_state(prVar25,rVar26);
      puVar22 = &local_78;
    }
    else {
      puVar22 = &local_78;
      if (-1 < (int)rtr_socket) {
        if ((ulong)in_stack_00000029 < 0xc) {
          UNRECOVERED_JUMPTABLE =
               (code *)((long)*(int *)((long)pdu + (ulong)in_stack_00000029 * 4) + (long)pdu);
switchD_00109fc7_switchD:
          iVar14 = (*UNRECOVERED_JUMPTABLE)();
          return iVar14;
        }
        lrtr_dbg("RTR Socket: Received unexpected PDU (Type: %u)",(ulong)in_stack_00000029);
        rtr_send_error_pdu_from_host
                  (prVar25,&stack0x00000028,8,CORRUPT_DATA,
                   "Unexpected PDU received during data synchronisation",0x34);
        puVar22 = &local_78;
      }
    }
LAB_0010a52f:
    *(undefined8 *)((long)puVar22 + -8) = 0xffffffffffffffff;
    iVar14 = (int)*(undefined8 *)((long)puVar22 + -8);
    puVar23 = puVar22;
LAB_0010a532:
    *(undefined8 *)((long)puVar23 + -8) = 0x10a53c;
    recv_loop_cleanup((undefined1 *)((long)puVar23 + 0x38));
    if (*(long *)(in_FS_OFFSET + 0x28) == *(long *)((long)puVar23 + 0x10110)) {
      return iVar14;
    }
    *(code **)((long)puVar23 + -8) = rtr_wait_for_sync;
    __stack_chk_fail();
  default:
    goto switchD_00109a35_caseD_13;
  case 0x18:
    LOCK();
    cVar10 = "RTR Socket: Removed outdated records from aspa_table"
             [(long)&__dest->session_id + uVar18 + 1];
    "RTR Socket: Removed outdated records from aspa_table"[(long)&__dest->session_id + uVar18 + 1] =
         cVar17;
    UNRECOVERED_JUMPTABLE = (code *)CONCAT71((int7)((ulong)ary >> 8),cVar10);
    UNLOCK();
    goto switchD_00109fc7_switchD;
  case 0x19:
    if (-1 < (long)ary) {
      uVar19 = SUB84(rtr_socket,0);
      header.ver = (char)uVar19;
      header.type = (char)((uint)uVar19 >> 8);
      header.reserved = (short)((uint)uVar19 >> 0x10);
      uVar13 = local_78._4_4_;
      memcpy((void *)((long)&__dest->tr_socket + (ulong)local_78._4_4_ * 0x7b),&stack0x00000028,0x7b
            );
      ary = (void **)((ulong)header & 0xffffffff);
      local_78 = (rtr_socket *)CONCAT44(uVar13 + 1,(undefined4)local_78);
      header.len._0_1_ = header.ver;
      header.len._1_1_ = header.type;
      header.len._2_2_ = header.reserved;
      pcVar27 = (char *)prVar25;
      goto LAB_00109f4c;
    }
    lrtr_dbg("RTR Socket: PDU type is unknown or reserved!");
    if (prVar25->session_id != (uint)in_stack_0000002a) {
      snprintf(&stack0x00010028,0x43,"Expected session_id: %u, received session_id. %u in EOD PDU");
      sVar16 = strlen(&stack0x00010028);
      rtr_send_error_pdu_from_host
                (prVar25,&stack0x00000028,0xffff,CORRUPT_DATA,&stack0x00010028,(int)sVar16 + 1);
      rVar26 = RTR_ERROR_FATAL;
      goto LAB_0010a52a;
    }
    if ((1 < (byte)(in_stack_00000028 - 1)) || (prVar25->iv_mode == RTR_INTERVAL_MODE_IGNORE_ANY)) {
LAB_0010a1fa:
      if (prVar25->is_resetting != true) {
        iVar14 = rtr_sync_update_tables
                           (prVar25,prVar25->pfx_table,prVar25->spki_table,prVar25->aspa_table,
                            in_stack_00000010,in_stack_00000008,in_stack_00000020,in_stack_0000001c,
                            unaff_retaddr,local_78._4_4_,(pdu_aspa **)unaff_RBP,unaff_R15,
                            (pdu_end_of_data_v0 *)&stack0x00000028);
        goto LAB_0010a532;
      }
      lrtr_dbg("RTR Socket: Reset in progress creating shadow table for atomic reset");
      pfx_table = (pdu_header)lrtr_malloc(0x50);
      pVar29 = pfx_table;
      if (pfx_table != (pdu_header)0x0) {
        pfx_table_init((pfx_table *)pfx_table,(pfx_update_fp)0x0);
        rtr_socket_00 = (rtr_socket *)prVar25->pfx_table;
        pcVar27 = (char *)prVar25;
        puVar21 = &local_78;
        goto code_r0x0010a239;
      }
      lrtr_dbg("RTR Socket: Memory allocation for pfx shadow table failed");
      spki_table = extraout_RAX_00;
      goto LAB_0010a37b;
    }
    iVar14 = rtr_check_interval_option
                       (prVar25,prVar25->iv_mode,in_stack_0000003c,RTR_INTERVAL_TYPE_EXPIRATION);
    if (iVar14 == -1) {
      uVar11 = 600;
      uVar15 = 0x2a300;
      in_stack_00000038 = in_stack_0000003c;
    }
    else {
      iVar14 = rtr_check_interval_option
                         (prVar25,prVar25->iv_mode,in_stack_00000034,RTR_INTERVAL_TYPE_REFRESH);
      if (iVar14 == -1) {
        uVar11 = 1;
        uVar15 = 0x15180;
        in_stack_00000038 = in_stack_00000034;
      }
      else {
        iVar14 = rtr_check_interval_option
                           (prVar25,prVar25->iv_mode,in_stack_00000038,RTR_INTERVAL_TYPE_RETRY);
        if (iVar14 != -1) {
          lrtr_dbg("RTR Socket: New interval values: expire_interval:%u, refresh_interval:%u, retry_interval:%u"
                   ,(ulong)prVar25->expire_interval,(ulong)prVar25->refresh_interval,
                   (ulong)prVar25->retry_interval);
          goto LAB_0010a1fa;
        }
        uVar11 = 1;
        uVar15 = 0x1c20;
      }
    }
    interval_send_error_pdu(prVar25,&stack0x00000028,in_stack_00000038,uVar11,uVar15);
    goto LAB_0010a52f;
  case 0x1b:
    if (header.len != 0) {
      txt._16_8_ = __dest;
      memcpy(__dest,&stack0x00000028,(size_t)rtr_socket);
      (&unaff_RBP->tr_socket)[unaff_R15] = (tr_socket *)txt._16_8_;
      ary = (void **)(unaff_R15 + 1);
      pcVar27 = (char *)prVar25;
      goto LAB_00109f4c;
    }
    lrtr_dbg("RTR Socket: %s");
    rtr_change_socket_state((rtr_socket *)txt._0_8_,RTR_ERROR_FATAL);
LAB_0010a524:
    rVar26 = RTR_ERROR_FATAL;
    prVar25 = (rtr_socket *)txt._0_8_;
    goto LAB_0010a52a;
  case 0x1c:
    anon_var_dwarf_6eb9[0] = '%';
    *(int *)&__dest->tr_socket = *(int *)&__dest->tr_socket + (int)in_R8;
    *(char *)ary = *(char *)ary + 'O';
    *(undefined1 *)(uVar18 - 0x6563d6) = *(undefined1 *)(uVar18 - 0x6563d6);
    UNRECOVERED_JUMPTABLE = (code *)swi(0xff);
    rtr_socket_00 = local_78;
    auVar32 = (*UNRECOVERED_JUMPTABLE)();
    Var7 = auVar32._0_10_;
    lVar1 = auVar32._0_8_ + -0x75;
    *(int *)lVar1 = *(int *)lVar1 + -1;
    bVar5 = POPCOUNT(*(uint *)lVar1 & 0xff);
    pcVar9 = txt;
switchD_00109a35_caseD_13:
    puVar22 = (undefined8 *)pcVar9;
    pcVar27 = (char *)rtr_socket;
    puVar21 = puVar22;
    if ((bVar5 & 1) == 0) {
code_r0x0010a239:
      *(undefined8 *)((long)puVar21 + -8) = 0x10a244;
      iVar14 = pfx_table_copy_except_socket
                         ((pfx_table *)rtr_socket_00,(pfx_table *)pVar29,(rtr_socket *)pcVar27);
      if (iVar14 == 0) {
LAB_0010a40e:
        *(undefined8 *)((long)puVar21 + -8) = 0x10a418;
        spki_table = (spki_table *)lrtr_malloc(0x170);
        if (spki_table == (spki_table *)0x0) {
          *(undefined8 *)((long)puVar21 + -8) = 0x10a4d4;
          lrtr_dbg("RTR Socket: Memory allocation for spki shadow table failed");
          *(undefined8 *)((long)puVar21 + -8) = 0xffffffffffffffff;
          iVar14 = (int)*(undefined8 *)((long)puVar21 + -8);
          spki_table = (spki_table *)0x0;
        }
        else {
          *(undefined8 *)((long)puVar21 + -8) = 0x10a430;
          spki_table_init(spki_table,(spki_update_fp)0x0);
          psVar2 = ((rtr_socket *)pcVar27)->spki_table;
          *(undefined8 *)((long)puVar21 + -8) = 0x10a43f;
          iVar14 = spki_table_copy_except_socket(psVar2,spki_table,(rtr_socket *)pcVar27);
          if (iVar14 == 0) {
            *(undefined8 *)((long)puVar21 + -8) = 0x10a5b9;
            pdu = lrtr_malloc(0x80);
            if ((spki_table *)pdu == (spki_table *)0x0) {
              pdu = (spki_table *)0x0;
              *(undefined8 *)((long)puVar21 + -8) = 0x10a656;
              lrtr_dbg("RTR Socket: Memory allocation for aspa shadow table failed");
              *(undefined8 *)((long)puVar21 + -8) = 0xffffffffffffffff;
              iVar14 = (int)*(undefined8 *)((long)puVar21 + -8);
            }
            else {
              *(undefined8 *)((long)puVar21 + -8) = 0x10a5d1;
              aspa_table_init((aspa_table *)pdu,(aspa_update_fp)0x0);
              *(undefined8 *)((long)puVar21 + -8) = 0x10a5df;
              lrtr_dbg("RTR Socket: Shadow tables created");
              *(undefined1 **)((long)puVar21 + -0x10) = (undefined1 *)((long)puVar21 + 0xa0);
              *(undefined8 *)((long)puVar21 + -0x18) = *(undefined8 *)((long)puVar21 + 0x68);
              *(undefined8 *)((long)puVar21 + -0x20) = *(undefined8 *)((long)puVar21 + 0x70);
              *(ulong *)((long)puVar21 + -0x28) = (ulong)*(uint *)((long)puVar21 + 4);
              *(undefined8 *)((long)puVar21 + -0x30) = *(undefined8 *)((long)puVar21 + 0x78);
              *(ulong *)((long)puVar21 + -0x38) = (ulong)*(uint *)((long)puVar21 + 0x94);
              *(undefined8 *)((long)puVar21 + -0x40) = *(undefined8 *)((long)puVar21 + 0x98);
              *(undefined8 *)((long)puVar21 + -0x48) = 0x10a636;
              iVar14 = rtr_sync_update_tables
                                 (prVar25,(pfx_table *)pVar29,spki_table,(aspa_table *)pdu,
                                  *(pdu_ipv4 **)((long)puVar21 + 0x88),
                                  *(uint *)((long)puVar21 + 0x80),
                                  *(pdu_ipv6 **)((long)puVar21 + -0x40),
                                  *(uint *)((long)puVar21 + -0x38),
                                  *(pdu_router_key **)((long)puVar21 + -0x30),
                                  *(uint *)((long)puVar21 + -0x28),
                                  *(pdu_aspa ***)((long)puVar21 + -0x20),
                                  *(size_t *)((long)puVar21 + -0x18),
                                  *(pdu_end_of_data_v0 **)((long)puVar21 + -0x10));
              if (iVar14 == 0) {
                *(void **)((long)puVar21 + 0x30) = pdu;
                *(undefined8 *)((long)puVar21 + -8) = 0x10a67e;
                lrtr_dbg("RTR Socket: Reset finished. Swapping new table in.");
                ppVar3 = prVar25->pfx_table;
                *(undefined8 *)((long)puVar21 + -8) = 0x10a68d;
                pfx_table_swap(ppVar3,(pfx_table *)pVar29);
                psVar2 = prVar25->spki_table;
                *(undefined8 *)((long)puVar21 + -8) = 0x10a699;
                spki_table_swap(psVar2,spki_table);
                pdu = *(void **)((long)puVar21 + 0x30);
                *(undefined8 *)((long)puVar21 + -8) = 0x10a6ad;
                lrtr_dbg("RTR Socket: Replacing ASPA records");
                dst = prVar25->aspa_table;
                p_Var4 = dst->update_fp;
                *(undefined8 *)((long)puVar21 + -8) = 0x10a6cb;
                aspa_table_src_replace
                          (dst,(aspa_table *)pdu,prVar25,p_Var4 != (aspa_update_fp)0x0,false);
                if (prVar25->pfx_table->update_fp == (pfx_update_fp)0x0) {
                  *(undefined8 *)((long)puVar21 + -8) = 0x10a703;
                  lrtr_dbg("RTR Socket: No pfx update callback. Skipping diff");
                }
                else {
                  *(undefined8 *)((long)puVar21 + -8) = 0x10a6e4;
                  lrtr_dbg("RTR Socket: Calculating and notifying pfx diff");
                  ppVar3 = prVar25->pfx_table;
                  *(undefined8 *)((long)puVar21 + -8) = 0x10a6f3;
                  pfx_table_notify_diff(ppVar3,(pfx_table *)pVar29,prVar25);
                }
                if (prVar25->spki_table->update_fp == (spki_update_fp)0x0) {
                  iVar14 = 0;
                  *(undefined8 *)((long)puVar21 + -8) = 0x10a742;
                  lrtr_dbg("RTR Socket: No spki update callback. Skipping diff");
                }
                else {
                  *(undefined8 *)((long)puVar21 + -8) = 0x10a71f;
                  lrtr_dbg("RTR Socket: Calculating and notifying spki diff");
                  psVar2 = prVar25->spki_table;
                  *(undefined8 *)((long)puVar21 + -8) = 0x10a72e;
                  spki_table_notify_diff(psVar2,spki_table,prVar25);
                  iVar14 = 0;
                }
              }
              else {
                *(undefined8 *)((long)puVar21 + -8) = 0xffffffffffffffff;
                iVar14 = (int)*(undefined8 *)((long)puVar21 + -8);
              }
            }
          }
          else {
            *(undefined8 *)((long)puVar21 + -8) = 0x10a455;
            lrtr_dbg("RTR Socket: Creation of spki shadow table failed");
            *(undefined8 *)((long)puVar21 + -8) = 7;
            uVar6 = *(undefined8 *)((long)puVar21 + -8);
            *(undefined8 *)((long)puVar21 + -8) = 0x10a460;
            rtr_change_socket_state((rtr_socket *)pcVar27,(rtr_socket_state)uVar6);
            *(undefined8 *)((long)puVar21 + -8) = 0xffffffffffffffff;
            iVar14 = (int)*(undefined8 *)((long)puVar21 + -8);
            pdu = spki_table;
          }
        }
      }
      else {
        *(undefined8 *)((long)puVar21 + -8) = 0x10a25a;
        lrtr_dbg("RTR Socket: Creation of pfx shadow table failed");
        *(undefined8 *)((long)puVar21 + -8) = 7;
        uVar6 = *(undefined8 *)((long)puVar21 + -8);
        *(undefined8 *)((long)puVar21 + -8) = 0x10a265;
        rtr_change_socket_state((rtr_socket *)pcVar27,(rtr_socket_state)uVar6);
        spki_table = extraout_RAX;
LAB_0010a37b:
        *(undefined8 *)((long)puVar21 + -8) = 0xffffffffffffffff;
        iVar14 = (int)*(undefined8 *)((long)puVar21 + -8);
      }
      *(undefined8 *)((long)puVar21 + -8) = 0x10a38f;
      lrtr_dbg("RTR Socket: Freeing shadow tables.");
      if (pfx_table != (pdu_header)0x0) {
        *(undefined8 *)((long)puVar21 + -8) = 0x10a39c;
        pfx_table_free_without_notify((pfx_table *)pVar29);
        *(undefined8 *)((long)puVar21 + -8) = 0x10a3a4;
        lrtr_free((void *)pVar29);
      }
      if (spki_table != (spki_table *)0x0) {
        *(undefined8 *)((long)puVar21 + -8) = 0x10a3b1;
        spki_table_free_without_notify(spki_table);
        *(undefined8 *)((long)puVar21 + -8) = 0x10a3b9;
        lrtr_free(spki_table);
      }
      if ((spki_table *)pdu != (spki_table *)0x0) {
        *(undefined8 *)((long)puVar21 + -8) = 0x10a3c8;
        aspa_table_free((aspa_table *)pdu,false);
        *(undefined8 *)((long)puVar21 + -8) = 0x10a3d0;
        lrtr_free(pdu);
      }
      prVar25->is_resetting = false;
      puVar23 = puVar21;
      goto LAB_0010a532;
    }
    lVar1 = (long)Var7 + -0x77;
    *(char *)lVar1 = *(char *)lVar1 + (char)ary;
    out((short)((unkuint10)Var7 >> 0x40),(int)Var7);
    *(undefined8 *)((long)puVar22 + -8) = 0x10a27a;
    rtr_handle_error_pdu(rtr_socket_00,pdu_00);
    goto LAB_0010a52f;
  case 0x1d:
    *(char *)&__dest->tr_socket = *(char *)&__dest->tr_socket + cVar10;
    iVar14 = rtr_store_prefix_pdu
                       ((rtr_socket *)"RTR Socket: PDU type is unknown or reserved!",pdu_00,0x114f64
                        ,ary,in_R8,(uint *)&stack0x0000000c);
    txt._0_8_ = rtr_socket;
    pcVar27 = (char *)rtr_socket;
    if (iVar14 == -1) goto LAB_0010a524;
LAB_00109f4c:
    iVar14 = __sigsetjmp(__buf);
    if (iVar14 == 0) {
      __pthread_register_cancel(__buf);
      pthread_setcancelstate(-1,(int *)pVar29);
      pdu_00 = &stack0x00000028;
      pdu_len_00 = (uint *)0x3c;
      prVar25 = (rtr_socket *)pcVar27;
      goto code_r0x00109f83;
    }
    recv_loop_cleanup(txt + 0x28);
    __pthread_unwind_next((__pthread_unwind_buf_t *)&stack0x00010028);
    puVar21 = &local_78;
    goto LAB_0010a40e;
  case 0x1e:
  case 0x1f:
    pcVar27 = (char *)((long)&__dest[-1].refresh_interval + 1);
    *pcVar27 = *pcVar27 + cVar17;
    goto switchD_0010aa5d_caseD_2;
  case 0x20:
  case 0x21:
  case 0x23:
  case 0x26:
    uVar11 = lrtr_convert_short(tbo,*(uint16_t *)((long)&rtr_socket->refresh_interval + 2));
    *(uint16_t *)((long)&rtr_socket->refresh_interval + 2) = uVar11;
    uVar15 = lrtr_convert_long(tbo,*(uint32_t *)&rtr_socket->field_0xc);
    *(uint32_t *)&rtr_socket->field_0xc = uVar15;
    uVar11 = *(uint16_t *)((long)&rtr_socket->refresh_interval + 2);
    if (tbo != TO_HOST_HOST_BYTE_ORDER) {
      uVar11 = lrtr_convert_short(TO_HOST_HOST_BYTE_ORDER,uVar11);
    }
    for (uVar30 = 0; uVar11 != uVar30; uVar30 = uVar30 + 1) {
      uVar15 = lrtr_convert_long(tbo,*(uint32_t *)((long)&rtr_socket->last_update + uVar30 * 4));
      *(uint32_t *)((long)&rtr_socket->last_update + uVar30 * 4) = uVar15;
    }
    goto switchD_0010aa5d_caseD_2;
  case 0x22:
    *(uint *)(uVar18 + 0x22a60e) = *(uint *)(uVar18 + 0x22a60e) | (uint)pdu_00;
    rtr_socket = (rtr_socket *)CONCAT62(uVar20,CONCAT11(0x73,(char)rtr_socket));
    *(char *)&__dest->tr_socket = *(char *)&__dest->tr_socket + cVar10;
    *(short *)((long)&rtr_socket->tr_socket + 2) = (short)header.len;
    pdu_00 = (undefined1 *)(ulong)*(uint *)((long)&rtr_socket->tr_socket + 4);
    bVar31 = *(rtr_socket **)(in_FS_OFFSET + 0x28) == local_78;
    goto code_r0x0010aa09;
  case 0x24:
    uVar15 = lrtr_convert_long(TO_HOST_HOST_BYTE_ORDER,rtr_socket->refresh_interval);
    rtr_socket->refresh_interval = uVar15;
    uVar15 = lrtr_convert_long(TO_HOST_HOST_BYTE_ORDER,
                               *(uint32_t *)(&rtr_socket->field_0xc + uVar15));
    __dest = (rtr_socket *)(ulong)uVar15;
    goto code_r0x0010aae5;
  case 0x25:
    bVar31 = cVar10 == -0x24;
code_r0x0010aa09:
    if (bVar31) {
      uVar15 = lrtr_convert_long(tbo,(uint32_t)pdu_00);
      *(uint32_t *)((long)&rtr_socket->tr_socket + 4) = uVar15;
      return uVar15;
    }
    __stack_chk_fail();
  case 0x27:
    rtr_socket = (rtr_socket *)CONCAT62(uVar20,CONCAT11(0x75,(char)rtr_socket));
    *(char *)&__dest->tr_socket = *(char *)&__dest->tr_socket + cVar10;
code_r0x0010aae5:
    *(int *)(&rtr_socket->field_0xc + rtr_socket->refresh_interval) = (int)__dest;
    goto switchD_0010aa5d_caseD_2;
  case 0x28:
    *(char *)&__dest->tr_socket = *(char *)&__dest->tr_socket + cVar10;
    iVar14 = (*(code *)((long)&switchD_0010aa5d::switchdataD_00114fdc +
                       (long)(int)(&switchD_0010aa5d::switchdataD_00114fdc)[(long)__dest]))();
    return iVar14;
  case 0x29:
    *(char *)(uVar18 - 0x1805a059) = *(char *)(uVar18 - 0x1805a059) + cVar17;
    *(char *)&__dest->tr_socket = *(char *)&__dest->tr_socket + cVar10;
    cRam000000003cda4d67 = cRam000000003cda4d67 + cVar17;
    anon_var_dwarf_6eb9._39_4_ = (uint)pdu_00 + 0x64657672;
    uVar15 = lrtr_convert_long(tbo,*(uint32_t *)((long)&rtr_socket->last_update + 4));
    *(uint32_t *)((long)&rtr_socket->last_update + 4) = uVar15;
    uVar15 = lrtr_convert_long(tbo,*(uint32_t *)&rtr_socket->field_0xc);
    *(uint32_t *)&rtr_socket->field_0xc = uVar15;
    uVar15 = lrtr_convert_long(tbo,(uint32_t)rtr_socket->last_update);
    *(uint32_t *)&rtr_socket->last_update = uVar15;
    uVar15 = lrtr_convert_long(tbo,rtr_socket->refresh_interval);
    rtr_socket->refresh_interval = uVar15;
switchD_0010aa5d_caseD_2:
    if (*(long *)(in_FS_OFFSET + 0x28) == txt._0_8_) {
      return (int)*(long *)(in_FS_OFFSET + 0x28);
    }
    __stack_chk_fail();
  }
  lrtr_dbg("RTR Socket: Received malformed PDU!");
LAB_0010989d:
  lrtr_dbg("RTR Socket: corrupt PDU received");
  pcVar27 = "corrupt data received, length value in PDU is too small";
  uVar15 = 0x38;
LAB_0010991f:
  rtr_send_error_pdu(rtr_socket,pdu,8,CORRUPT_DATA,pcVar27,uVar15);
LAB_00109924:
  rVar26 = RTR_ERROR_FATAL;
LAB_00109926:
  rtr_change_socket_state(rtr_socket,rVar26);
LAB_00109932:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return iVar14;
  }
  __stack_chk_fail();
}

Assistant:

static int rtr_receive_pdu(struct rtr_socket *rtr_socket, void *pdu, const size_t pdu_len, const time_t timeout)
{
	int error = RTR_SUCCESS;

	assert(pdu_len >= RTR_MAX_PDU_LEN);

	if (rtr_socket->state == RTR_SHUTDOWN)
		return RTR_ERROR;
	// receive packet header
	error = tr_recv_all(rtr_socket->tr_socket, pdu, sizeof(struct pdu_header), timeout);
	if (error < 0)
		goto error;
	else
		error = RTR_SUCCESS;

	// header in hostbyte order, retain original received pdu, in case we need to detach it to an error pdu
	struct pdu_header header;

	memcpy(&header, pdu, sizeof(header));
	rtr_pdu_header_to_host_byte_order(&header);

	// if header->len is < packet_header = corrupt data received
	if (header.len < sizeof(header)) {
		error = CORRUPT_DATA;
		goto error;
	} else if (header.len > RTR_MAX_PDU_LEN) { // PDU too big, > than MAX_PDU_LEN Bytes
		error = PDU_TOO_BIG;
		goto error;
	}

	// Handle live downgrading
	if (!rtr_socket->has_received_pdus) {
		if (header.type != ERROR && rtr_socket->version > header.ver && rtr_version_supported(header.ver)) {
			RTR_DBG("First received PDU is a version %u PDU, downgrading from version %u to %u", header.ver,
				rtr_socket->version, header.ver);
			rtr_socket->version = header.ver;
		}
		rtr_socket->has_received_pdus = true;
	}

	// Handle wrong protocol version
	// If it is a error PDU, it will be handled by rtr_handle_error_pdu
	if (header.ver != rtr_socket->version && header.type != ERROR) {
		error = UNEXPECTED_PROTOCOL_VERSION;
		goto error;
	}

	// receive packet payload
	const unsigned int remaining_len = header.len - sizeof(header);

	if (remaining_len > 0) {
		if (rtr_socket->state == RTR_SHUTDOWN)
			return RTR_ERROR;
		error = tr_recv_all(rtr_socket->tr_socket, (((char *)pdu) + sizeof(header)), remaining_len,
				    RTR_RECV_TIMEOUT);
		if (error < 0)
			goto error;
		else
			error = RTR_SUCCESS;
	}
	// copy header in host_byte_order to pdu
	memcpy(pdu, &header, sizeof(header));

	// Check if the header len value is valid
	if (rtr_pdu_check_size(pdu) == false) {
		// TODO Restore byteorder for sending error PDU
		error = CORRUPT_DATA;
		goto error;
	}
	// At this point it is save to cast and use the PDU

	rtr_pdu_footer_to_host_byte_order(pdu);

	// Here we should handle error PDUs instead of doing it in
	// several other places...

	if (header.type == IPV4_PREFIX || header.type == IPV6_PREFIX) {
		if (((struct pdu_ipv4 *)pdu)->zero != 0)
			RTR_DBG1("Warning: Zero field of received Prefix PDU doesn't contain 0");
	}
	if (header.type == ASPA) {
		if (((struct pdu_aspa *)pdu)->ver != RTR_PROTOCOL_VERSION_2) {
			error = UNSUPPORTED_PROTOCOL_VER;
			goto error;
		}

		if (((struct pdu_aspa *)pdu)->zero != 0)
			RTR_DBG1("Warning: Zero field of received ASPA PDU doesn't contain 0");

		if (((struct pdu_aspa *)pdu)->afi_flags != 0b11)
			RTR_DBG1("Warning: AFI flags of received ASPA PDU not set to 0x03");
	}
	if (header.type == ROUTER_KEY && ((struct pdu_router_key *)pdu)->zero != 0)
		RTR_DBG1("Warning: ROUTER_KEY_PDU zero field is != 0");

	return RTR_SUCCESS;

error:
	// send error msg to server, including unmodified pdu header(pdu variable instead header)
	if (error == -1) {
		rtr_change_socket_state(rtr_socket, RTR_ERROR_TRANSPORT);
		return RTR_ERROR;
	} else if (error == TR_WOULDBLOCK) {
		RTR_DBG1("receive timeout expired");
		return TR_WOULDBLOCK;
	} else if (error == TR_INTR) {
		RTR_DBG1("receive call interrupted");
		return TR_INTR;
	} else if (error == CORRUPT_DATA) {
		RTR_DBG1("corrupt PDU received");
		const char txt[] = "corrupt data received, length value in PDU is too small";

		rtr_send_error_pdu_from_network(rtr_socket, pdu, sizeof(header), CORRUPT_DATA, txt, sizeof(txt));
	} else if (error == PDU_TOO_BIG) {
		RTR_DBG1("PDU too big");
		char txt[43];

		snprintf(txt, sizeof(txt), "PDU too big, max. PDU size is: %lu bytes", RTR_MAX_PDU_LEN);
		RTR_DBG("%s", txt);
		rtr_send_error_pdu_from_network(rtr_socket, pdu, sizeof(header), CORRUPT_DATA, txt, sizeof(txt));
	} else if (error == UNSUPPORTED_PDU_TYPE) {
		RTR_DBG("Unsupported PDU type (%u) received", header.type);
		rtr_send_error_pdu_from_network(rtr_socket, pdu, sizeof(header), UNSUPPORTED_PDU_TYPE, NULL, 0);
	} else if (error == UNSUPPORTED_PROTOCOL_VER) {
		RTR_DBG("PDU with unsupported Protocol version (%u) received", header.ver);
		rtr_send_error_pdu_from_network(rtr_socket, pdu, sizeof(header), UNSUPPORTED_PROTOCOL_VER, NULL, 0);
		return RTR_ERROR;
	} else if (error == UNEXPECTED_PROTOCOL_VERSION) {
		RTR_DBG("PDU with unexpected Protocol version (%u) received", header.ver);
		rtr_send_error_pdu_from_network(rtr_socket, pdu, sizeof(header), UNEXPECTED_PROTOCOL_VERSION, NULL, 0);
		return RTR_ERROR;
	}

	rtr_change_socket_state(rtr_socket, RTR_ERROR_FATAL);
	return RTR_ERROR;
}